

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O1

string * __thiscall
mp::SolverOption::format_description_abi_cxx11_
          (string *__return_storage_ptr__,SolverOption *this,int indent)

{
  undefined **ppuVar1;
  undefined **ppuVar2;
  undefined4 in_register_00000014;
  CStringRef s;
  undefined8 in_R9;
  ValueArrayRef values;
  MemoryWriter writer;
  undefined **local_248;
  undefined ***local_240;
  undefined **local_238;
  undefined1 *local_230;
  undefined8 local_228;
  ulong local_220;
  undefined1 local_218 [504];
  
  s.data_._4_4_ = in_register_00000014;
  s.data_._0_4_ = indent;
  local_240 = &local_238;
  local_248 = &PTR__BasicMemoryWriter_0028b328;
  local_228 = 0;
  local_220 = 500;
  local_238 = &PTR_grow_0028b370;
  values.values_ = (OptionValueInfo *)(ulong)(uint)(this->values_).size_;
  values._8_8_ = in_R9;
  local_230 = local_218;
  internal::FormatRST((internal *)&local_248,(Writer *)(this->description_)._M_dataplus._M_p,s,
                      (int)(this->values_).values_,values);
  ppuVar1 = local_240[1];
  ppuVar2 = local_240[2];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,ppuVar1,(long)ppuVar2 + (long)ppuVar1);
  local_248 = &PTR__BasicMemoryWriter_0028b328;
  local_238 = &PTR_grow_0028b370;
  if (local_230 != local_218) {
    operator_delete(local_230,local_220);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_description(int indent=0) const {
    fmt::MemoryWriter writer;
    format_description(writer, indent);
    return writer.str();
  }